

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O1

void ParseVersion(string *version,int *major,int *minor)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  long *local_48 [2];
  long local_38 [2];
  
  lVar1 = std::__cxx11::string::find((char)version,0x2e);
  std::__cxx11::string::substr((ulong)local_48,(ulong)version);
  plVar2 = local_48[0];
  iVar3 = atoi((char *)local_48[0]);
  *major = iVar3;
  if (plVar2 != local_38) {
    operator_delete(plVar2,local_38[0] + 1);
  }
  *minor = 0;
  if (lVar1 != -1) {
    std::__cxx11::string::find((char)version,0x2e);
    std::__cxx11::string::substr((ulong)local_48,(ulong)version);
    iVar3 = atoi((char *)local_48[0]);
    *minor = iVar3;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void ParseVersion(const string& version, int* major, int* minor) {
  size_t end = version.find('.');
  *major = atoi(version.substr(0, end).c_str());
  *minor = 0;
  if (end != string::npos) {
    size_t start = end + 1;
    end = version.find('.', start);
    *minor = atoi(version.substr(start, end).c_str());
  }
}